

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O1

value object_metadata(object obj)

{
  char *__s;
  value pvVar1;
  value *ppvVar2;
  value pvVar3;
  size_t length;
  value pvVar4;
  
  pvVar1 = value_create_array((value *)0x0,2);
  pvVar3 = (value)0x0;
  if (pvVar1 != (value)0x0) {
    ppvVar2 = value_to_array(pvVar1);
    pvVar3 = value_create_string("name",4);
    *ppvVar2 = pvVar3;
    if (pvVar3 != (value)0x0) {
      __s = obj->name;
      length = strlen(__s);
      pvVar4 = value_create_string(__s,length);
      ppvVar2[1] = pvVar4;
      pvVar3 = pvVar1;
      if (pvVar4 != (value)0x0) goto LAB_00108735;
    }
    value_type_destroy(pvVar1);
    pvVar3 = (value)0x0;
  }
LAB_00108735:
  if (pvVar3 != (value)0x0) {
    pvVar1 = value_create_map((value *)0x0,1);
    if (pvVar1 != (value)0x0) {
      ppvVar2 = value_to_map(pvVar1);
      *ppvVar2 = pvVar3;
      return pvVar1;
    }
    value_type_destroy(pvVar3);
  }
  return (value)0x0;
}

Assistant:

value object_metadata(object obj)
{
	value name, f;

	value *f_map;

	/* Create object name array */
	name = object_metadata_name(obj);

	if (name == NULL)
	{
		return NULL;
	}

	/* Create object map (name) */
	f = value_create_map(NULL, 1);

	if (f == NULL)
	{
		value_type_destroy(name);

		return NULL;
	}

	f_map = value_to_map(f);

	f_map[0] = name;

	return f;
}